

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

int addk(FuncState *fs,TValue *key,TValue *v)

{
  byte bVar1;
  Proto *o;
  lua_State *L;
  int iVar2;
  TValue *pTVar3;
  lu_byte *plVar4;
  long lVar5;
  int iVar6;
  Value VVar7;
  TValue val;
  
  o = fs->f;
  L = fs->ls->L;
  pTVar3 = luaH_get(fs->ls->h,key);
  if ((pTVar3->tt_ == '\x03') && (iVar6 = (int)(pTVar3->value_).i, iVar6 < fs->nk)) {
    if ((((v->tt_ ^ o->k[iVar6].tt_) & 0x3f) == 0) &&
       (iVar2 = luaV_equalobj((lua_State *)0x0,o->k + iVar6,v), iVar2 != 0)) {
      return iVar6;
    }
  }
  lVar5 = (long)o->sizek;
  iVar6 = fs->nk;
  VVar7 = (Value)(long)iVar6;
  val.tt_ = '\x03';
  val.value_ = VVar7;
  luaH_finishset(L,fs->ls->h,key,pTVar3,&val);
  pTVar3 = (TValue *)luaM_growaux_(L,o->k,iVar6,&o->sizek,0x10,0x1ffffff,"constants");
  o->k = pTVar3;
  iVar2 = o->sizek;
  plVar4 = &pTVar3[lVar5].tt_;
  for (; lVar5 < iVar2; lVar5 = lVar5 + 1) {
    *plVar4 = '\0';
    plVar4 = plVar4 + 0x10;
  }
  pTVar3[VVar7.i].value_ = v->value_;
  bVar1 = v->tt_;
  pTVar3[VVar7.i].tt_ = bVar1;
  fs->nk = fs->nk + 1;
  if ((((bVar1 & 0x40) != 0) && ((o->marked & 0x20) != 0)) &&
     ((((v->value_).gc)->marked & 0x18) != 0)) {
    luaC_barrier_(L,(GCObject *)o,(v->value_).gc);
  }
  return iVar6;
}

Assistant:

static int addk (FuncState *fs, TValue *key, TValue *v) {
  TValue val;
  lua_State *L = fs->ls->L;
  Proto *f = fs->f;
  const TValue *idx = luaH_get(fs->ls->h, key);  /* query scanner table */
  int k, oldsize;
  if (ttisinteger(idx)) {  /* is there an index there? */
    k = cast_int(ivalue(idx));
    /* correct value? (warning: must distinguish floats from integers!) */
    if (k < fs->nk && ttypetag(&f->k[k]) == ttypetag(v) &&
                      luaV_rawequalobj(&f->k[k], v))
      return k;  /* reuse index */
  }
  /* constant not found; create a new entry */
  oldsize = f->sizek;
  k = fs->nk;
  /* numerical value does not need GC barrier;
     table has no metatable, so it does not need to invalidate cache */
  setivalue(&val, k);
  luaH_finishset(L, fs->ls->h, key, idx, &val);
  luaM_growvector(L, f->k, k, f->sizek, TValue, MAXARG_Ax, "constants");
  while (oldsize < f->sizek) setnilvalue(&f->k[oldsize++]);
  setobj(L, &f->k[k], v);
  fs->nk++;
  luaC_barrier(L, f, v);
  return k;
}